

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  StorageClass SVar1;
  bool bVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  SPIRVariable *var;
  Bitset *pBVar8;
  undefined4 in_register_0000000c;
  uint *puVar9;
  Variant *pVVar10;
  undefined3 in_register_00000081;
  char *addr_space;
  Bitset flags;
  allocator local_c5;
  uint local_c4;
  string *local_c0;
  uint32_t local_b8;
  uint32_t local_b4;
  Bitset local_b0;
  Bitset local_70;
  
  local_c4 = CONCAT31(in_register_00000081,argument);
  pVVar10 = (Variant *)CONCAT44(in_register_0000000c,id);
  this_00 = &local_70.higher;
  local_70.lower = 0;
  local_70.higher._M_h._M_buckets = &local_70.higher._M_h._M_single_bucket;
  local_70.higher._M_h._M_bucket_count = 1;
  local_70.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70.higher._M_h._M_element_count = 0;
  local_70.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70.higher._M_h._M_rehash_policy._M_next_resize = 0;
  local_70.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar7 = (ulong)id;
  local_c0 = __return_storage_ptr__;
  if ((uVar7 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar10 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.ptr, pVVar10[uVar7].type == TypeVariable)) {
    var = Variant::get<spirv_cross::SPIRVariable>(pVVar10 + uVar7);
  }
  else {
    var = (SPIRVariable *)0x0;
  }
  if (((var == (SPIRVariable *)0x0) || (type->basetype != Struct)) ||
     ((bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block),
      !bVar2 && (bVar2 = Compiler::has_decoration
                                   ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock)
                , !bVar2)))) {
    pBVar8 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    pVVar10 = (Variant *)pBVar8->lower;
    local_70.lower = (uint64_t)pVVar10;
    if (pBVar8 != &local_70) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00,&(pBVar8->higher)._M_h);
    }
  }
  else {
    Compiler::get_buffer_block_flags(&local_b0,(Compiler *)this,(VariableID)id);
    local_70.lower = local_b0.lower;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&this_00->_M_h,&local_b0.higher);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b0.higher._M_h);
  }
  local_b0.lower = 0;
  SVar1 = type->storage;
  puVar9 = &switchD_00234f80::switchdataD_0039486c;
  switch(SVar1) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case PushConstant:
    if (type->basetype == Struct) {
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock);
      pVVar10 = (Variant *)0x3a0bc9;
      if (((uint)local_70.lower >> 0x18 & 1) == 0) {
        pVVar10 = (Variant *)0x398ca8;
      }
      puVar9 = (uint *)(Variant *)0x35f061;
      local_b0.lower = (uint64_t)(Variant *)0x35f061;
      if (bVar2) {
        puVar9 = (uint *)pVVar10;
        local_b0.lower = (uint64_t)pVVar10;
      }
    }
    else if ((char)local_c4 == '\0') {
      local_b0.lower = (uint64_t)(Variant *)0x35f061;
    }
    else if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
            ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      local_b0.lower = (uint64_t)(Variant *)0x35ca19;
    }
    break;
  case Input:
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if ((((var != (SPIRVariable *)0x0) && (EVar4 == ExecutionModelTessellationControl)) &&
        ((var->basevariable).id == (this->stage_in_ptr_var_id).id)) &&
       (puVar9 = (uint *)0x398d5b, local_b0.lower = (uint64_t)puVar9,
       (this->msl_options).multi_patch_workgroup != false)) {
      puVar9 = (uint *)0x3a0bc9;
      local_b0.lower = (uint64_t)puVar9;
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if (((EVar4 == ExecutionModelTessellationEvaluation) && (var != (SPIRVariable *)0x0)) &&
       (((this->msl_options).raw_buffer_tese_input & 1U) != 0)) {
      local_b4 = (var->basevariable).id;
      local_b8 = (this->stage_in_ptr_var_id).id;
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPatch);
      bVar3 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
      uVar5 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
      puVar9 = (uint *)(ulong)local_b8;
      if ((local_b4 == local_b8) || (bVar2 && (!bVar3 || 1 < uVar5 - 0xb))) {
        local_b0.lower = 0x3a0bc9;
      }
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if (((var != (SPIRVariable *)0x0) && (EVar4 == ExecutionModelFragment)) &&
       ((var->basevariable).id == (this->stage_in_var_id).id)) {
      local_b0.lower = (uint64_t)(Variant *)0x398c28;
    }
    break;
  case Output:
    if (this->capture_output_to_buffer == true) {
      if (var != (SPIRVariable *)0x0) {
        bVar2 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
        if (bVar2) {
          bVar2 = Compiler::is_tessellation_shader((Compiler *)this);
          if (bVar2) {
LAB_002351fd:
            local_b0.lower = 0x398d5b;
          }
          else {
            local_b0.lower = 0x398c28;
          }
        }
        else {
          iVar6 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,var,4);
          if ((char)iVar6 != '\0') goto LAB_002351fd;
        }
      }
      if ((Variant *)local_b0.lower == (Variant *)0x0) {
        local_b0.lower = 0x398ca8;
      }
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if (EVar4 != ExecutionModelMeshEXT) break;
  case StorageClassWorkgroup:
    local_b0.lower = (uint64_t)(Variant *)0x398d5b;
    break;
  case CrossWorkgroup:
  case Private:
  case Function:
  case Generic:
  case AtomicCounter:
  case Image:
    break;
  default:
    puVar9 = (uint *)pVVar10;
    if (SVar1 != PhysicalStorageBuffer) {
      if (SVar1 == StorageClassTaskPayloadWorkgroupEXT) {
        EVar4 = Compiler::get_execution_model((Compiler *)this);
        puVar9 = (uint *)pVVar10;
        if (EVar4 == ExecutionModelMeshEXT) {
          local_b0.lower = (uint64_t)(Variant *)0x398e1d;
        }
        else {
          local_b0.lower = (uint64_t)(Variant *)0x398dd9;
        }
      }
      break;
    }
  case StorageBuffer:
    if ((var == (SPIRVariable *)0x0) ||
       (bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block),
       bVar2)) {
      puVar9 = (uint *)(Variant *)0x398ca8;
      local_b0.lower = (uint64_t)(Variant *)0x3a0bc9;
      if ((local_70.lower & 0x1000000) == 0) {
        local_b0.lower = (uint64_t)(Variant *)0x398ca8;
      }
    }
    else {
      local_b0.lower = (uint64_t)(Variant *)0x398ca8;
    }
  }
  if ((Variant *)local_b0.lower == (Variant *)0x0) {
    puVar9 = (uint *)0x35ca19;
    local_b0.lower = 0x35ca19;
    if (type->basetype == ControlPointArray) {
      local_b0.lower = 0x398c28;
    }
    if ((local_c4 & 1) == 0) {
      local_b0.lower = 0x35ca19;
    }
    if (type->pointer != false) {
      local_b0.lower = 0x398c28;
    }
  }
  if (((local_70.lower & 0xa00000) == 0) ||
     (iVar6 = strcmp((char *)local_b0.lower,"thread"), iVar6 == 0)) {
    ::std::__cxx11::string::string((string *)local_c0,(char *)local_b0.lower,&local_c5);
  }
  else {
    join<char_const(&)[10],char_const*&>
              (local_c0,(spirv_cross *)"volatile ",(char (*) [10])&local_b0,(char **)puVar9);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  return local_c0;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}

		if (is_mesh_shader())
			addr_space = "threadgroup";
		break;

	case StorageClassTaskPayloadWorkgroupEXT:
		if (is_mesh_shader())
			addr_space = "const object_data";
		else
			addr_space = "object_data";
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	if (decoration_flags_signal_volatile(flags) && 0 != strcmp(addr_space, "thread"))
		return join("volatile ", addr_space);
	else
		return addr_space;
}